

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_read_num_from_non_numeric_mp<double,int(*)(char_const**,double*)>
               (_func_int_char_ptr_ptr_double_ptr *read_f)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pos;
  _func_int_char_ptr_ptr_double_ptr *local_248;
  double val;
  char local_238 [256];
  char str [256];
  
  builtin_strncpy(str + 0x10,"f reading ",0xb);
  builtin_strncpy(str,"ensure failure o",0x10);
  local_248 = read_f;
  if (read_f == mp_read_double) {
    builtin_strncpy(str + 0x1d,"ble",4);
  }
  else {
    if (read_f != mp_read_double_lossy) {
      abort();
    }
    builtin_strncpy(str + 0x2a,"ision loss",0xb);
    builtin_strncpy(str + 0x1d,"ble with prec",0xd);
  }
  str[0x1b] = 'o';
  str[0x1c] = 'u';
  str[0x1a] = 'd';
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(str,_stdout);
  fputc(10,_stdout);
  local_238[0] = -0x6f;
  local_238[0x10] = 0x81;
  mp_encode_str0(local_238 + 0x20,"abc");
  local_238[0x30] = 0xc3;
  local_238[0x41] = 3;
  local_238[0x41] = 3;
  local_238[0x40] = 199;
  local_238[0x42] = 1;
  local_238[0x45] = 99;
  local_238[0x43] = 'a';
  local_238[0x44] = 'b';
  local_238[0x50] = -0x3c;
  local_238[0x51] = '\x03';
  local_238[0x52] = 'a';
  local_238[0x53] = 'b';
  local_238[0x54] = 99;
  local_238[0x60] = 0xc0;
  for (lVar4 = 0; lVar4 != 0x70; lVar4 = lVar4 + 0x10) {
    pcVar3 = local_238 + lVar4;
    cVar1 = *pcVar3;
    pos = pcVar3;
    iVar2 = (*local_248)(&pos,&val);
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76d,"check fail for code 0x%02X",(ulong)(uint)(int)cVar1);
    _ok((uint)(pcVar3 == pos),"pos == bad_types[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x76e,"check position for code 0x%02X",(ulong)(uint)(int)cVar1);
  }
  return;
}

Assistant:

static void
test_read_num_from_non_numeric_mp(ReadF read_f)
{
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "ensure failure of reading ");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else if (read_f == (void *)mp_read_double) {
		pos += snprintf(pos, end - pos, "double");
	} else if (read_f == (void *)mp_read_double_lossy) {
		pos += snprintf(pos, end - pos, "double with precision loss");
	} else {
		abort();
	}
	note("%s", str);

	char bad_types[16][16];
	int bad_count = 0;
	mp_encode_array(bad_types[bad_count++], 1);
	mp_encode_map(bad_types[bad_count++], 1);
	mp_encode_str0(bad_types[bad_count++], "abc");
	mp_encode_bool(bad_types[bad_count++], true);
	mp_encode_ext(bad_types[bad_count++], 1, "abc", 3);
	mp_encode_bin(bad_types[bad_count++], "abc", 3);
	mp_encode_nil(bad_types[bad_count++]);
	for (int i = 0; i < bad_count; ++i) {
		TargetT val;
		const char *pos = bad_types[i];
		char code = *pos;
		int rc = read_f(&pos, &val);
		is(rc, -1, "check fail for code 0x%02X", code);
		is(pos, bad_types[i], "check position for code 0x%02X", code);
	}
}